

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

void setsvarchecked(ident *id,char *val)

{
  uint uVar1;
  char *pcVar2;
  identstack *piVar3;
  char *fmt;
  
  uVar1 = id->flags;
  if ((uVar1 & 8) != 0) {
    pcVar2 = id->name;
    fmt = "variable %s is read-only";
LAB_0012acdc:
    debugcode(fmt,pcVar2);
    return;
  }
  if ((uVar1 & 2) == 0 && (identflags & 0x10U) == 0) {
    if ((uVar1 & 0x10) != 0) {
      if ((id->field_5).stack != (identstack *)0x0) {
        operator_delete__((id->field_5).stack);
        uVar1 = id->flags;
      }
      id->flags = uVar1 & 0xffffffef;
    }
    piVar3 = *(identstack **)(id->field_4).args;
  }
  else {
    if ((uVar1 & 1) != 0) {
      pcVar2 = id->name;
      fmt = "cannot override persistent variable %s";
      goto LAB_0012acdc;
    }
    piVar3 = *(identstack **)(id->field_4).args;
    if ((uVar1 & 0x10) == 0) {
      (id->field_5).stack = piVar3;
      id->flags = uVar1 | 0x10;
      goto LAB_0012acb0;
    }
  }
  if (piVar3 != (identstack *)0x0) {
    operator_delete__(piVar3);
  }
LAB_0012acb0:
  pcVar2 = newstring(val);
  *(char **)(id->field_4).args = pcVar2;
  if (id->fun != (identfun)0x0) {
    (*id->fun)();
    return;
  }
  return;
}

Assistant:

void setsvarchecked(ident *id, const char *val)
{
    if(id->flags&IDF_READONLY) debugcode("variable %s is read-only", id->name);
else
    {
        OVERRIDEVAR(return, id->overrideval.s = *id->storage.s, delete[] id->overrideval.s, delete[] *id->storage.s);
        *id->storage.s = newstring(val);
        id->changed();
    }
}